

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

UINT8 device_start_gameboy_sound(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData;
  gb_sound_t *gb;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0x138);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    *(UINT32 *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf = cfg->clock >> 6;
    if ((cfg->srMode == '\x01') ||
       ((cfg->srMode == '\x02' &&
        (*(uint *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf < cfg->smplRate)))) {
      *(UINT32 *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf = cfg->smplRate;
    }
    *(bool *)&((DEV_DATA *)((long)devData.chipInf + 0x130))->chipInf = (cfg->flags & 1) != 0;
    RC_SET_RATIO((RATIO_CNTR *)((long)devData.chipInf + 0x120),cfg->clock,
                 *(UINT32 *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf);
    gameboy_sound_set_mute_mask(devData.chipInf,0);
    *(undefined1 *)((long)devData.chipInf + 0x131) = 0;
    *(undefined1 *)((long)devData.chipInf + 0x132) = 0;
    *(undefined1 *)((long)devData.chipInf + 0x133) = 0;
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,*(UINT32 *)((long)devData.chipInf + 8),&devDef
               );
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_gameboy_sound(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	gb_sound_t *gb;

	gb = (gb_sound_t *)calloc(1, sizeof(gb_sound_t));
	if (gb == NULL)
		return 0xFF;

	gb->rate = cfg->clock / 64;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, gb->rate, cfg->smplRate);

	gb->gbMode = (cfg->flags & 0x01) ? GBMODE_CGB04 : GBMODE_DMG;
	RC_SET_RATIO(&gb->cycleCntr, cfg->clock, gb->rate);

	gameboy_sound_set_mute_mask(gb, 0x00);
	gb->BoostWaveChn = 0x00;
	gb->NoWaveCorrupt = 0x00;
	gb->LegacyMode = 0x00;

	gb->_devData.chipInf = gb;
	INIT_DEVINF(retDevInf, &gb->_devData, gb->rate, &devDef);

	return 0x00;
}